

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::insert_node_before(xml_node_struct *child,xml_node_struct *node)

{
  xml_node_struct *pxVar1;
  xml_node_struct *parent;
  xml_node_struct *node_local;
  xml_node_struct *child_local;
  
  pxVar1 = node->parent;
  child->parent = pxVar1;
  if (node->prev_sibling_c->next_sibling == (xml_node_struct *)0x0) {
    pxVar1->first_child = child;
  }
  else {
    node->prev_sibling_c->next_sibling = child;
  }
  child->prev_sibling_c = node->prev_sibling_c;
  child->next_sibling = node;
  node->prev_sibling_c = child;
  return;
}

Assistant:

inline void insert_node_before(xml_node_struct* child, xml_node_struct* node)
	{
		xml_node_struct* parent = node->parent;

		child->parent = parent;

		if (node->prev_sibling_c->next_sibling)
			node->prev_sibling_c->next_sibling = child;
		else
			parent->first_child = child;

		child->prev_sibling_c = node->prev_sibling_c;
		child->next_sibling = node;

		node->prev_sibling_c = child;
	}